

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::BitState<unsigned_int>,int,duckdb::BitOrOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  idx_t iVar12;
  idx_t iVar13;
  ulong uVar14;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  long *local_b8;
  long local_b0;
  long local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if (*input == (Vector)0x0) {
    if (*states == (Vector)0x0) {
      lVar2 = *(long *)(input + 0x20);
      lVar3 = *(long *)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      lVar4 = *(long *)(input + 0x28);
      if (lVar4 == 0) {
        if (count == 0) {
          return;
        }
        iVar11 = 0;
        do {
          pcVar1 = *(char **)(lVar3 + iVar11 * 8);
          uVar6 = *(uint *)(lVar2 + iVar11 * 4);
          if (*pcVar1 == '\0') {
            *pcVar1 = '\x01';
          }
          else {
            uVar6 = uVar6 | *(uint *)(pcVar1 + 4);
          }
          *(uint *)(pcVar1 + 4) = uVar6;
          iVar11 = iVar11 + 1;
        } while (count != iVar11);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar7 = 0;
      uVar9 = 0;
      do {
        uVar5 = *(ulong *)(lVar4 + uVar7 * 8);
        uVar8 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar8 = count;
        }
        uVar10 = uVar8;
        if (uVar5 != 0) {
          uVar10 = uVar9;
          if (uVar5 == 0xffffffffffffffff) {
            if (uVar9 < uVar8) {
              do {
                pcVar1 = *(char **)(lVar3 + uVar9 * 8);
                uVar6 = *(uint *)(lVar2 + uVar9 * 4);
                if (*pcVar1 == '\0') {
                  *pcVar1 = '\x01';
                }
                else {
                  uVar6 = uVar6 | *(uint *)(pcVar1 + 4);
                }
                *(uint *)(pcVar1 + 4) = uVar6;
                uVar9 = uVar9 + 1;
                uVar10 = uVar8;
              } while (uVar8 != uVar9);
            }
          }
          else if (uVar9 < uVar8) {
            uVar14 = 0;
            do {
              if ((uVar5 >> (uVar14 & 0x3f) & 1) != 0) {
                pcVar1 = *(char **)(lVar3 + uVar9 * 8 + uVar14 * 8);
                uVar6 = *(uint *)(lVar2 + uVar9 * 4 + uVar14 * 4);
                if (*pcVar1 == '\0') {
                  *(uint *)(pcVar1 + 4) = uVar6;
                  *pcVar1 = '\x01';
                }
                else {
                  *(uint *)(pcVar1 + 4) = *(uint *)(pcVar1 + 4) | uVar6;
                }
              }
              uVar14 = uVar14 + 1;
              uVar10 = uVar8;
            } while (uVar8 - uVar9 != uVar14);
          }
        }
        uVar7 = uVar7 + 1;
        uVar9 = uVar10;
      } while (uVar7 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
      return;
    }
    pcVar1 = (char *)**(undefined8 **)(states + 0x20);
    uVar6 = **(uint **)(input + 0x20);
    if (*pcVar1 == '\0') {
      *pcVar1 = '\x01';
    }
    else {
      uVar6 = uVar6 | *(uint *)(pcVar1 + 4);
    }
    *(uint *)(pcVar1 + 4) = uVar6;
    return;
  }
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
  duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  if (local_a8 == 0) {
    if (count != 0) {
      lVar2 = *local_b8;
      lVar3 = *local_70;
      iVar11 = 0;
      do {
        iVar12 = iVar11;
        if (lVar2 != 0) {
          iVar12 = (idx_t)*(uint *)(lVar2 + iVar11 * 4);
        }
        iVar13 = iVar11;
        if (lVar3 != 0) {
          iVar13 = (idx_t)*(uint *)(lVar3 + iVar11 * 4);
        }
        pcVar1 = *(char **)(local_68 + iVar13 * 8);
        uVar6 = *(uint *)(local_b0 + iVar12 * 4);
        if (*pcVar1 == '\0') {
          *pcVar1 = '\x01';
        }
        else {
          uVar6 = uVar6 | *(uint *)(pcVar1 + 4);
        }
        *(uint *)(pcVar1 + 4) = uVar6;
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
    }
  }
  else if (count != 0) {
    lVar2 = *local_b8;
    lVar3 = *local_70;
    iVar11 = 0;
    do {
      iVar12 = iVar11;
      if (lVar2 != 0) {
        iVar12 = (idx_t)*(uint *)(lVar2 + iVar11 * 4);
      }
      iVar13 = iVar11;
      if (lVar3 != 0) {
        iVar13 = (idx_t)*(uint *)(lVar3 + iVar11 * 4);
      }
      if ((*(ulong *)(local_a8 + (iVar12 >> 6) * 8) >> (iVar12 & 0x3f) & 1) != 0) {
        pcVar1 = *(char **)(local_68 + iVar13 * 8);
        uVar6 = *(uint *)(local_b0 + iVar12 * 4);
        if (*pcVar1 == '\0') {
          *(uint *)(pcVar1 + 4) = uVar6;
          *pcVar1 = '\x01';
        }
        else {
          *(uint *)(pcVar1 + 4) = *(uint *)(pcVar1 + 4) | uVar6;
        }
      }
      iVar11 = iVar11 + 1;
    } while (count != iVar11);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}